

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O2

void __thiscall MyClass::Test(MyClass *this)

{
  liblogger::ProxyLogger::LogDebug((char *)this,"Debug Logging #1");
  liblogger::ProxyLogger::LogDebug((char *)this,"Debug Logging #%d",2);
  liblogger::ProxyLogger::LogInfo((char *)this,"Info Logging #1");
  liblogger::ProxyLogger::LogInfo((char *)this,"Info Logging #%d",2);
  liblogger::ProxyLogger::LogNotice((char *)this,"Notice Logging #1");
  liblogger::ProxyLogger::LogNotice((char *)this,"%s Logging #2","Notice");
  liblogger::ProxyLogger::LogWarning((char *)this,"Warning!!!!!!");
  liblogger::ProxyLogger::LogWarning((char *)this,"Warning!!!!!! #%d",2);
  liblogger::ProxyLogger::LogError((char *)this,"This is an Error");
  liblogger::ProxyLogger::LogError((char *)this,"This is an Error %d",2);
  liblogger::ProxyLogger::LogError((char *)this,"Something Critical happened");
  liblogger::ProxyLogger::LogError((char *)this,"Something Critical happened %s","Really BAD!");
  liblogger::ProxyLogger::LogAlert((char *)this,"Alert Alert");
  liblogger::ProxyLogger::LogAlert((char *)this,"Alert Alert %s","Alert");
  liblogger::ProxyLogger::LogCritical((char *)this,"TestLog Critical!");
  liblogger::ProxyLogger::LogEmergency((char *)this,"TestLog Emergency!");
  return;
}

Assistant:

void Test() {
            LogDebug("Debug Logging #1");
            LogDebug("Debug Logging #%d", 2);

            LogInfo("Info Logging #1");
            LogInfo("Info Logging #%d", 2);

            LogNotice("Notice Logging #1");
            LogNotice("%s Logging #2", "Notice");

            LogWarning("Warning!!!!!!");
            LogWarning("Warning!!!!!! #%d", 2);

            LogError("This is an Error");
            LogError("This is an Error %d", 2);

            LogError("Something Critical happened");
            LogError("Something Critical happened %s", "Really BAD!");

            LogAlert("Alert Alert");
            LogAlert("Alert Alert %s", "Alert");

            LogCritical("TestLog Critical!");

            LogEmergency("TestLog Emergency!");
        }